

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O1

void zCreate_Dense_Matrix
               (SuperMatrix *X,int m,int n,doublecomplex *x,int ldx,Stype_t stype,Dtype_t dtype,
               Mtype_t mtype)

{
  int *piVar1;
  void *pvVar2;
  char acStack_128 [264];
  
  X->Stype = stype;
  X->Dtype = dtype;
  X->Mtype = mtype;
  X->nrow = m;
  X->ncol = n;
  pvVar2 = superlu_malloc(0x10);
  X->Store = pvVar2;
  if (pvVar2 == (void *)0x0) {
    sprintf(acStack_128,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for X->Store",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zutil.c");
    superlu_abort_and_exit(acStack_128);
  }
  piVar1 = (int *)X->Store;
  *piVar1 = ldx;
  *(doublecomplex **)(piVar1 + 2) = x;
  return;
}

Assistant:

void
zCreate_Dense_Matrix(SuperMatrix *X, int m, int n, doublecomplex *x, int ldx,
		    Stype_t stype, Dtype_t dtype, Mtype_t mtype)
{
    DNformat    *Xstore;
    
    X->Stype = stype;
    X->Dtype = dtype;
    X->Mtype = mtype;
    X->nrow = m;
    X->ncol = n;
    X->Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !(X->Store) ) ABORT("SUPERLU_MALLOC fails for X->Store");
    Xstore = (DNformat *) X->Store;
    Xstore->lda = ldx;
    Xstore->nzval = (doublecomplex *) x;
}